

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.h
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::pushScope(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,ScopeCtx *scope)

{
  bool bVar1;
  bool bVar2;
  mapped_type *this_00;
  size_type sVar3;
  uint *puVar4;
  Err *pEVar5;
  Ok local_199;
  Err local_198;
  Err *local_178;
  Err *err_2;
  Result<wasm::Ok> _val_2;
  Err *err_1;
  Result<wasm::Ok> _val_1;
  Err local_f0;
  Err *local_d0;
  Err *err;
  undefined1 local_b8 [8];
  Result<unsigned_int> _val;
  undefined1 local_88 [8];
  Result<unsigned_int> scratch;
  Index inputLocal;
  value_type_conflict2 local_54;
  bool hasInput;
  size_t sStack_50;
  size_t local_48;
  string_view local_40;
  undefined1 local_30 [8];
  Name label;
  ScopeCtx *scope_local;
  IRBuilder *this_local;
  
  label.super_IString.str._M_str = (char *)scope;
  _local_30 = (string_view)ScopeCtx::getOriginalLabel(scope);
  bVar1 = IString::operator_cast_to_bool((IString *)local_30);
  if (bVar1) {
    bVar1 = IString::operator_cast_to_bool((IString *)(label.super_IString.str._M_str + 0x20));
    if (!bVar1) {
      sStack_50 = (size_t)local_30;
      local_48 = label.super_IString.str._M_len;
      local_40 = (string_view)makeFresh(this,(Name)_local_30,0);
      wasm::Name::operator=((Name *)(label.super_IString.str._M_str + 0x20),(Name *)&local_40);
    }
    this_00 = std::
              unordered_map<wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::operator[](&this->labelDepths,(key_type *)local_30);
    sVar3 = std::vector<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>::size
                      (&this->scopeStack);
    local_54 = (int)sVar3 + 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_00,&local_54);
  }
  if (this->binaryPos != (size_t *)0x0) {
    *(size_t *)(label.super_IString.str._M_str + 0xa8) = this->lastBinaryPos;
    this->lastBinaryPos = *this->binaryPos;
  }
  scratch.val.super__Variant_base<unsigned_int,_wasm::Err>.
  super__Move_assign_alias<unsigned_int,_wasm::Err>.
  super__Copy_assign_alias<unsigned_int,_wasm::Err>.super__Move_ctor_alias<unsigned_int,_wasm::Err>.
  super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
  super__Variant_storage_alias<unsigned_int,_wasm::Err>._36_4_ = 0;
  bVar1 = wasm::Type::operator!=
                    ((Type *)(label.super_IString.str._M_str + 0x48),
                     (BasicType *)
                     ((long)&scratch.val.super__Variant_base<unsigned_int,_wasm::Err>.
                             super__Move_assign_alias<unsigned_int,_wasm::Err>.
                             super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                             super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                             super__Copy_ctor_alias<unsigned_int,_wasm::Err> + 0x24));
  scratch.val.super__Variant_base<unsigned_int,_wasm::Err>.
  super__Move_assign_alias<unsigned_int,_wasm::Err>.
  super__Copy_assign_alias<unsigned_int,_wasm::Err>.super__Move_ctor_alias<unsigned_int,_wasm::Err>.
  super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
  super__Variant_storage_alias<unsigned_int,_wasm::Err>._M_index =
       label.super_IString.str._M_str[0x50];
  scratch.val.super__Variant_base<unsigned_int,_wasm::Err>.
  super__Move_assign_alias<unsigned_int,_wasm::Err>.
  super__Copy_assign_alias<unsigned_int,_wasm::Err>.super__Move_ctor_alias<unsigned_int,_wasm::Err>.
  super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
  super__Variant_storage_alias<unsigned_int,_wasm::Err>._33_1_ =
       label.super_IString.str._M_str[0x51];
  scratch.val.super__Variant_base<unsigned_int,_wasm::Err>.
  super__Move_assign_alias<unsigned_int,_wasm::Err>.
  super__Copy_assign_alias<unsigned_int,_wasm::Err>.super__Move_ctor_alias<unsigned_int,_wasm::Err>.
  super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
  super__Variant_storage_alias<unsigned_int,_wasm::Err>._34_1_ =
       label.super_IString.str._M_str[0x52];
  scratch.val.super__Variant_base<unsigned_int,_wasm::Err>.
  super__Move_assign_alias<unsigned_int,_wasm::Err>.
  super__Copy_assign_alias<unsigned_int,_wasm::Err>.super__Move_ctor_alias<unsigned_int,_wasm::Err>.
  super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
  super__Variant_storage_alias<unsigned_int,_wasm::Err>._35_1_ =
       label.super_IString.str._M_str[0x53];
  if ((bVar1) && (bVar2 = ScopeCtx::isDelimiter((ScopeCtx *)label.super_IString.str._M_str), !bVar2)
     ) {
    if (scratch.val.super__Variant_base<unsigned_int,_wasm::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_4_ == -1) {
      _val.val.super__Variant_base<unsigned_int,_wasm::Err>.
      super__Move_assign_alias<unsigned_int,_wasm::Err>.
      super__Copy_assign_alias<unsigned_int,_wasm::Err>.
      super__Move_ctor_alias<unsigned_int,_wasm::Err>.
      super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
      super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_ =
           *(undefined8 *)(label.super_IString.str._M_str + 0x48);
      addScratchLocal((Result<unsigned_int> *)local_88,this,
                      (Type)_val.val.super__Variant_base<unsigned_int,_wasm::Err>.
                            super__Move_assign_alias<unsigned_int,_wasm::Err>.
                            super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                            super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                            super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                            super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_8_);
      Result<unsigned_int>::Result
                ((Result<unsigned_int> *)local_b8,(Result<unsigned_int> *)local_88);
      local_d0 = Result<unsigned_int>::getErr((Result<unsigned_int> *)local_b8);
      _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = local_d0 != (Err *)0x0;
      if ((bool)_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_) {
        wasm::Err::Err(&local_f0,local_d0);
        Result<wasm::Ok>::Result(__return_storage_ptr__,&local_f0);
        wasm::Err::~Err(&local_f0);
      }
      _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
      Result<unsigned_int>::~Result((Result<unsigned_int> *)local_b8);
      if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
        puVar4 = Result<unsigned_int>::operator*((Result<unsigned_int> *)local_88);
        scratch.val.super__Variant_base<unsigned_int,_wasm::Err>.
        super__Move_assign_alias<unsigned_int,_wasm::Err>.
        super__Copy_assign_alias<unsigned_int,_wasm::Err>.
        super__Move_ctor_alias<unsigned_int,_wasm::Err>.
        super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
        super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_4_ = *puVar4;
        *(undefined4 *)(label.super_IString.str._M_str + 0x50) =
             scratch.val.super__Variant_base<unsigned_int,_wasm::Err>.
             super__Move_assign_alias<unsigned_int,_wasm::Err>.
             super__Copy_assign_alias<unsigned_int,_wasm::Err>.
             super__Move_ctor_alias<unsigned_int,_wasm::Err>.
             super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
             super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_4_;
        _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ = 0;
      }
      Result<unsigned_int>::~Result((Result<unsigned_int> *)local_88);
      if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ != 0) {
        return __return_storage_ptr__;
      }
    }
    makeLocalSet((Result<wasm::Ok> *)&err_1,this,
                 scratch.val.super__Variant_base<unsigned_int,_wasm::Err>.
                 super__Move_assign_alias<unsigned_int,_wasm::Err>.
                 super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                 super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                 super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                 super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_4_);
    pEVar5 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_1);
    if (pEVar5 != (Err *)0x0) {
      wasm::Err::Err((Err *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),pEVar5);
      Result<wasm::Ok>::Result
                (__return_storage_ptr__,
                 (Err *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      wasm::Err::~Err((Err *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    }
    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = pEVar5 != (Err *)0x0;
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_1);
    if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ != 0) {
      return __return_storage_ptr__;
    }
  }
  std::vector<wasm::IRBuilder::ScopeCtx,_std::allocator<wasm::IRBuilder::ScopeCtx>_>::
  emplace_back<wasm::IRBuilder::ScopeCtx>
            (&this->scopeStack,(ScopeCtx *)label.super_IString.str._M_str);
  if (bVar1) {
    makeLocalGet((Result<wasm::Ok> *)&err_2,this,
                 scratch.val.super__Variant_base<unsigned_int,_wasm::Err>.
                 super__Move_assign_alias<unsigned_int,_wasm::Err>.
                 super__Copy_assign_alias<unsigned_int,_wasm::Err>.
                 super__Move_ctor_alias<unsigned_int,_wasm::Err>.
                 super__Copy_ctor_alias<unsigned_int,_wasm::Err>.
                 super__Variant_storage_alias<unsigned_int,_wasm::Err>._32_4_);
    local_178 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_2);
    bVar1 = local_178 != (Err *)0x0;
    if (bVar1) {
      wasm::Err::Err(&local_198,local_178);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_198);
      wasm::Err::~Err(&local_198);
    }
    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
    _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
    super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
    super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = bVar1;
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_2);
    if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ != 0) {
      return __return_storage_ptr__;
    }
  }
  Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_199);
  return __return_storage_ptr__;
}

Assistant:

Result<> pushScope(ScopeCtx&& scope) {
    if (auto label = scope.getOriginalLabel()) {
      // Assign a fresh label to the scope, if necessary.
      if (!scope.label) {
        scope.label = makeFresh(label);
      }
      // Record the original label to handle references to it correctly.
      labelDepths[label].push_back(scopeStack.size() + 1);
    }
    if (binaryPos) {
      scope.startPos = lastBinaryPos;
      lastBinaryPos = *binaryPos;
    }
    bool hasInput = scope.inputType != Type::none;
    Index inputLocal = scope.inputLocal;
    if (hasInput && !scope.isDelimiter()) {
      if (inputLocal == Index(-1)) {
        auto scratch = addScratchLocal(scope.inputType);
        CHECK_ERR(scratch);
        inputLocal = scope.inputLocal = *scratch;
      }
      CHECK_ERR(makeLocalSet(inputLocal));
    }
    scopeStack.emplace_back(std::move(scope));
    if (hasInput) {
      CHECK_ERR(makeLocalGet(inputLocal));
    }
    return Ok{};
  }